

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O1

int first_g(uint *I_end,int m,int h)

{
  uint uVar1;
  int iVar2;
  int R;
  
  iVar2 = 0;
  if (-1 < m) {
    do {
      uVar1 = (uint)(m + iVar2) >> 1;
      if (I_end[uVar1] < (uint)h) {
        iVar2 = uVar1 + 1;
      }
      else {
        if (I_end[uVar1] <= (uint)h) {
          return uVar1 + 1;
        }
        m = uVar1 - 1;
      }
    } while (iVar2 <= m);
  }
  return iVar2;
}

Assistant:

int first_g(unsigned int* I_end, int m, int h)
{
    int L = 0, R = m;
    int i;
    while(L<=R)
    {
        i = (L+R) / 2;
        if(I_end[i]<h)
            L = i + 1;
        else if(I_end[i]>h)
            R = i - 1;
        else
            return i+1;
    }
  return L;
}